

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_left_stepping_padding.cpp
# Opt level: O3

void test_2d_dynamic<5ul,5ul,0ul,1ul,30ul,30ul>(void)

{
  int *t;
  undefined8 uVar1;
  int *piVar2;
  ulong uVar3;
  int *piVar4;
  long lVar5;
  char *pcVar6;
  value_type true_idx;
  vector<int,_std::allocator<int>_> data;
  int *local_90;
  int *local_88;
  int *local_80;
  ulong local_78;
  vector<int,_std::allocator<int>_> local_70;
  int *local_58;
  pointer local_50;
  ulong local_48;
  pointer local_40;
  long local_38;
  
  local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,1);
  local_88 = (int *)CONCAT71(local_88._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0xaf,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(bool *)&local_70,(bool *)&local_88);
  local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1;
  local_88._0_4_ = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0xb1,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&local_70,(int *)&local_88);
  local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1e;
  local_88 = (int *)CONCAT44(local_88._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0xb2,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&local_70,(int *)&local_88);
  local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x384;
  local_88 = (int *)0x384;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0xb4,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&local_70,(unsigned_long *)&local_88);
  local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&DAT_000003a2;
  local_88 = (int *)0x3a2;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","(X + PadX) * (Y + PadY)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0xb5,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&local_70,(unsigned_long *)&local_88);
  local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,1);
  local_88 = (int *)CONCAT71(local_88._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(sub_l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0xbd,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(bool *)&local_70,(bool *)&local_88);
  local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x5;
  local_88 = (int *)0x5;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(0))","StepX",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0xbf,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&local_70,(unsigned_long *)&local_88);
  local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x96;
  local_88 = (int *)0x5;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(1))","StepY",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0xc0,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&local_70,(unsigned_long *)&local_88);
  local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x24;
  local_88 = (int *)0x24;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.size())","(X / StepX) * (Y / StepY)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0xc2,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&local_70,(unsigned_long *)&local_88);
  local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&DAT_000003a2;
  local_88 = (int *)0x3a2;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.span())","(X + PadX) * (Y + PadY)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0xc3,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&local_70,(unsigned_long *)&local_88);
  local_88 = (int *)CONCAT44(local_88._4_4_,0x2a);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_70,0x3a2,(value_type_conflict1 *)&local_88,(allocator_type *)&local_90);
  piVar4 = (int *)0x0;
  local_40 = local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
  local_78 = 0;
  local_80 = (int *)0x0;
  do {
    lVar5 = 0;
    local_58 = piVar4;
    do {
      piVar2 = (int *)(local_78 + lVar5);
      local_90 = piVar2;
      local_88 = piVar2;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0xd1,
                 "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(unsigned_long *)&local_90,(unsigned_long *)&local_88);
      t = (int *)((long)local_40 + (long)piVar4);
      local_50 = local_40 + (long)local_88;
      local_90 = t;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0xd3,
                 "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,&local_90,&local_50);
      if (local_80 == (int *)0x1e) {
        *t = 0x18;
        local_90._0_4_ = 0x18;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","24",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                   ,0xe5,
                   "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                   ,t,(int *)&local_90);
        if ((int *)((long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) <= piVar2) goto LAB_00109b70;
        local_90 = (int *)CONCAT44(local_90._4_4_,0x18);
        boost::detail::test_eq_impl<int,int>
                  ("(data.at(l.index(i, j)))","24",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                   ,0xe8,
                   "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                   ,(int *)((long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start + (long)piVar4),(int *)&local_90)
        ;
      }
      lVar5 = lVar5 + 1;
      piVar4 = piVar4 + 1;
    } while (lVar5 != 0x1e);
    local_80 = (int *)((long)local_80 + 1);
    local_78 = local_78 + 0x1e;
    piVar4 = local_58 + 0x1e;
  } while (local_80 != (int *)0x1f);
  piVar2 = (int *)0x0;
  pcVar6 = 
  "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]";
  local_78 = 0;
  local_48 = 0;
  do {
    lVar5 = 0;
    local_58 = piVar2;
    do {
      local_90 = (int *)(local_78 + lVar5);
      local_88 = local_90;
      local_80 = local_90;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(sub_l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0xf4,
                 "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(unsigned_long *)&local_90,(unsigned_long *)&local_88);
      piVar4 = (int *)((long)local_40 + (long)piVar2);
      local_50 = local_40 + (long)local_88;
      local_90 = piVar4;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[sub_l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0xf6,
                 "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,&local_90,&local_50);
      *piVar4 = 0x47;
      local_90._0_4_ = 0x47;
      boost::detail::test_eq_impl<int,int>
                ("(dptr[sub_l.index(i, j)])","71",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0xfa,
                 "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,piVar4,(int *)&local_90);
      if ((int *)((long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) <= local_80) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        goto LAB_00109b5f;
      }
      local_90 = (int *)CONCAT44(local_90._4_4_,0x47);
      boost::detail::test_eq_impl<int,int>
                ("(data.at(sub_l.index(i, j)))","71",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0xfd,
                 "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(int *)((long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start + (long)piVar2),(int *)&local_90);
      lVar5 = lVar5 + 5;
      piVar2 = piVar2 + 5;
    } while (lVar5 != 0x1e);
    local_48 = local_48 + 1;
    local_78 = local_78 + 0x96;
    piVar2 = local_58 + 0x96;
  } while (local_48 != 6);
  lVar5 = 0;
  local_58 = (int *)0x0;
  uVar3 = 0;
  do {
    local_48 = uVar3 % 5;
    local_80 = (int *)0x0;
    piVar2 = (int *)0x0;
    local_78 = uVar3;
    local_38 = lVar5;
    do {
      pcVar6 = (char *)((long)local_58 + (long)piVar2);
      local_90 = (int *)pcVar6;
      local_88 = (int *)pcVar6;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0x106,
                 "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(unsigned_long *)&local_90,(unsigned_long *)&local_88);
      piVar4 = (int *)((long)local_40 + lVar5);
      local_50 = local_40 + (long)local_88;
      local_90 = piVar4;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0x108,
                 "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,&local_90,&local_50);
      if (local_78 == 0x1e) {
        local_90._0_4_ = 0x18;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","24",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                   ,0x116,
                   "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                   ,piVar4,(int *)&local_90);
        if ((int *)((long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) <= pcVar6) goto LAB_00109b5f;
        local_90 = (int *)CONCAT44(local_90._4_4_,0x18);
        boost::detail::test_eq_impl<int,int>
                  ("(data.at(l.index(i, j)))","24",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                   ,0x119,
                   "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                   ,(int *)((long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start + lVar5),(int *)&local_90);
      }
      else if ((local_48 == 0) &&
              ((char)((char)(((uint)piVar2 & 0xff) / 5) * '\x05' + (char)local_80) == '\0')) {
        local_90._0_4_ = 0x47;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","71",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                   ,0x124,
                   "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                   ,piVar4,(int *)&local_90);
        if ((int *)((long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) <= pcVar6) goto LAB_00109b5f;
        local_90 = (int *)CONCAT44(local_90._4_4_,0x47);
        boost::detail::test_eq_impl<int,int>
                  ("(data.at(l.index(i, j)))","71",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                   ,0x127,
                   "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                   ,(int *)((long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start + lVar5),(int *)&local_90);
      }
      else {
        local_90._0_4_ = 0x2a;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","42",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                   ,300,
                   "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                   ,piVar4,(int *)&local_90);
        if ((int *)((long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) <= pcVar6) {
LAB_00109b5f:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     pcVar6);
LAB_00109b70:
          uVar1 = std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,piVar2);
          if (local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          _Unwind_Resume(uVar1);
        }
        local_90 = (int *)CONCAT44(local_90._4_4_,0x2a);
        boost::detail::test_eq_impl<int,int>
                  ("(data.at(l.index(i, j)))","42",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                   ,0x12f,
                   "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                   ,(int *)((long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start + lVar5),(int *)&local_90);
      }
      piVar2 = (int *)((long)piVar2 + 1);
      local_80 = (int *)CONCAT71((int7)((ulong)local_80 >> 8),(char)local_80 + -1);
      lVar5 = lVar5 + 4;
    } while (piVar2 != (int *)0x1e);
    uVar3 = local_78 + 1;
    local_58 = (int *)((long)local_58 + 0x1e);
    lVar5 = local_38 + 0x78;
    if (uVar3 == 0x1f) {
      if (local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      return;
    }
  } while( true );
}

Assistant:

void test_2d_dynamic()
{ // {{{
    layout_mapping_left<
        dimensions<dyn, dyn>
      , dimensions<dyn, dyn>
      , dimensions<dyn, dyn>
    > const l{{X, Y}, {1, 1}, {PadX, PadY}};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), (X + PadX) * (Y + PadY));

    layout_mapping_left<
        dimensions<dyn, dyn>
      , dimensions<dyn, dyn>
      , dimensions<dyn, dyn>
    > const sub_l{{X / StepX, Y / StepY}, {StepX, StepY}, {PadX, PadY}};

    BOOST_TEST_EQ((sub_l.is_regular()), true);

    BOOST_TEST_EQ((sub_l.stride(0)), StepX);
    BOOST_TEST_EQ((sub_l.stride(1)), StepY);

    BOOST_TEST_EQ((sub_l.size()), (X / StepX) * (Y / StepY));
    BOOST_TEST_EQ((sub_l.span()), (X + PadX) * (Y + PadY));

    // Initialize all elements to 42.
    std::vector<int> data(
        (l[0] + l.pads()[0]) * (l[1] + l.pads()[1]), 42
    );
    int* dptr = data.data();

    // Set X pad elements to 17 and Y pad elements to 24. 
    for (auto j = 0; j < l[1] + l.pads()[1]; ++j)
    for (auto i = 0; i < l[0] + l.pads()[0]; ++i)
    {
        auto const true_idx = (i) + (l[0] + l.pads()[0]) * (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.pads()[0])))
        {
            dptr[l.index(i, j)] = 17;
            
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.pads()[1])))
        {
            dptr[l.index(i, j)] = 24; 

            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 24);
        }
    }

    // Set every (StepXth, StepYth) element to 71.
    for (auto j = 0; j < sub_l[1]; ++j)
    for (auto i = 0; i < sub_l[0]; ++i)
    {
        auto const p = l.pads();
        auto const s = sub_l.steps();
        auto const true_idx = (s[0] * i) + (sub_l[0] * s[0] + p[0]) * (s[1] * j);

        BOOST_TEST_EQ((sub_l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[sub_l.index(i, j)]), &(dptr[true_idx])); 

        dptr[sub_l.index(i, j)] = 71;

        BOOST_TEST_EQ((dptr[sub_l.index(i, j)]), 71);

        // Bounds-checking.
        BOOST_TEST_EQ((data.at(sub_l.index(i, j))), 71);
    }

    // Check final structure. 
    for (auto j = 0; j < l[1] + l.pads()[1]; ++j)
    for (auto i = 0; i < l[0] + l.pads()[0]; ++i)
    {
        auto const true_idx = (i) + (l[0] + l.pads()[0]) * (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.pads()[0])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.pads()[1])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 24);
        }

        // Real element.
        else
        {
            // Real element in the strided sub-box.
            if (  (0 == (i % sub_l.steps()[0]))
               && (0 == (j % sub_l.steps()[1]))
               )
            {
                BOOST_TEST_EQ((dptr[l.index(i, j)]), 71);

                // Bounds-checking.
                BOOST_TEST_EQ((data.at(l.index(i, j))), 71);
            }
            // Real element not in the strided sub-box.
            else
            {
                BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);

                // Bounds-checking.
                BOOST_TEST_EQ((data.at(l.index(i, j))), 42);
            }
        }
    }
}